

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsgf.c
# Opt level: O0

fsg_model_t *
jsgf_build_fsg_internal
          (jsgf_t *grammar,jsgf_rule_t *rule,logmath_t *lmath,float32 lw,int do_closure)

{
  int32 iVar1;
  int32 iVar2;
  jsgf_atom_t *pjVar3;
  int iVar4;
  int logp;
  glist_t pgVar5;
  int wid;
  jsgf_link_t *link;
  gnode_t *gn;
  glist_t nulls;
  fsg_model_t *fsg;
  int do_closure_local;
  float32 lw_local;
  logmath_t *lmath_local;
  jsgf_rule_t *rule_local;
  jsgf_t *grammar_local;
  
  if ((grammar == (jsgf_t *)0x0) || (rule == (jsgf_rule_t *)0x0)) {
    grammar_local = (jsgf_t *)0x0;
  }
  else {
    for (link = (jsgf_link_t *)grammar->links; link != (jsgf_link_t *)0x0;
        link = *(jsgf_link_t **)&link->from) {
      ckd_free(link->atom);
    }
    glist_free(grammar->links);
    grammar->links = (glist_t)0x0;
    rule->exit = 0;
    rule->entry = 0;
    grammar->nstate = 0;
    expand_rule(grammar,rule);
    grammar_local = (jsgf_t *)fsg_model_init(rule->name,lmath,lw,grammar->nstate);
    ((fsg_model_t *)grammar_local)->start_state = rule->entry;
    ((fsg_model_t *)grammar_local)->final_state = rule->exit;
    pgVar5 = glist_reverse(grammar->links);
    grammar->links = pgVar5;
    for (link = (jsgf_link_t *)grammar->links; link != (jsgf_link_t *)0x0;
        link = *(jsgf_link_t **)&link->from) {
      pjVar3 = link->atom;
      if (pjVar3->name == (char *)0x0) {
        fsg_model_null_trans_add
                  ((fsg_model_t *)grammar_local,*(int32 *)&pjVar3->tags,
                   *(int32 *)((long)&pjVar3->tags + 4),0);
      }
      else if (**(char **)pjVar3->name == '<') {
        iVar1 = *(int32 *)&pjVar3->tags;
        iVar2 = *(int32 *)((long)&pjVar3->tags + 4);
        iVar4 = logmath_log(lmath,(float64)(double)*(float *)(pjVar3->name + 0x10));
        fsg_model_null_trans_add((fsg_model_t *)grammar_local,iVar1,iVar2,iVar4);
      }
      else {
        iVar4 = fsg_model_word_add((fsg_model_t *)grammar_local,*(char **)pjVar3->name);
        iVar1 = *(int32 *)&pjVar3->tags;
        iVar2 = *(int32 *)((long)&pjVar3->tags + 4);
        logp = logmath_log(lmath,(float64)(double)*(float *)(pjVar3->name + 0x10));
        fsg_model_trans_add((fsg_model_t *)grammar_local,iVar1,iVar2,logp,iVar4);
      }
    }
    if (do_closure != 0) {
      pgVar5 = fsg_model_null_trans_closure((fsg_model_t *)grammar_local,(glist_t)0x0);
      glist_free(pgVar5);
    }
  }
  return (fsg_model_t *)grammar_local;
}

Assistant:

static fsg_model_t *
jsgf_build_fsg_internal(jsgf_t * grammar, jsgf_rule_t * rule,
                        logmath_t * lmath, float32 lw, int do_closure)
{
    fsg_model_t *fsg;
    glist_t nulls;
    gnode_t *gn;
    
    if (grammar == NULL || rule == NULL)
	return NULL;

    /* Clear previous links */
    for (gn = grammar->links; gn; gn = gnode_next(gn)) {
        ckd_free(gnode_ptr(gn));
    }
    glist_free(grammar->links);
    grammar->links = NULL;
    rule->entry = rule->exit = 0;
    grammar->nstate = 0;
    expand_rule(grammar, rule);

    fsg = fsg_model_init(rule->name, lmath, lw, grammar->nstate);
    fsg->start_state = rule->entry;
    fsg->final_state = rule->exit;
    grammar->links = glist_reverse(grammar->links);
    for (gn = grammar->links; gn; gn = gnode_next(gn)) {
        jsgf_link_t *link = gnode_ptr(gn);

        if (link->atom) {
            if (jsgf_atom_is_rule(link->atom)) {
                fsg_model_null_trans_add(fsg, link->from, link->to,
                                         logmath_log(lmath,
                                                     link->atom->weight));
            }
            else {
                int wid = fsg_model_word_add(fsg, link->atom->name);
                fsg_model_trans_add(fsg, link->from, link->to,
                                    logmath_log(lmath, link->atom->weight),
                                    wid);
            }
        }
        else {
            fsg_model_null_trans_add(fsg, link->from, link->to, 0);
        }
    }
    if (do_closure) {
        nulls = fsg_model_null_trans_closure(fsg, NULL);
        glist_free(nulls);
    }

    return fsg;
}